

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.hpp
# Opt level: O2

void __thiscall CaDiCaL::Internal::mark_block(Internal *this,int lit)

{
  anon_struct_32_4_19eae2fe_for_mark *paVar1;
  pointer pFVar2;
  ulong uVar3;
  uint uVar4;
  
  uVar3 = (ulong)(uint)-lit;
  if (0 < lit) {
    uVar3 = (ulong)(uint)lit;
  }
  pFVar2 = (this->ftab).super__Vector_base<CaDiCaL::Flags,_std::allocator<CaDiCaL::Flags>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar4 = 1 - (lit >> 0x1f);
  if (((uint)pFVar2[uVar3] >> 0xd & uVar4) != 0) {
    return;
  }
  paVar1 = &(this->stats).mark;
  paVar1->block = paVar1->block + 1;
  pFVar2 = pFVar2 + uVar3;
  *pFVar2 = (Flags)((uint)*pFVar2 | uVar4 * 0x2000);
  return;
}

Assistant:

int vidx (int lit) const {
    int idx;
    assert (lit);
    assert (lit != INT_MIN);
    idx = abs (lit);
    assert (idx <= max_var);
    return idx;
  }